

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CStructure::emitlab(CStructure *this,char *iid,aint address,bool isRelocatable)

{
  size_t sVar1;
  char sn [2048];
  
  if ((-address & this->maxAlignment - 1U) != 0 && this->maxAlignment != 0) {
    snprintf(sn,0x800,
             "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
             this->naam);
    Warning(sn,(char *)0x0,W_PASS3);
  }
  memset(sn,0,0x800);
  strcpy(sn,iid);
  InsertSingleStructLabel(true,sn,isRelocatable,address,false);
  sVar1 = strlen(sn);
  (sn + sVar1)[0] = '.';
  (sn + sVar1)[1] = '\0';
  InsertStructSubLabels(sn,isRelocatable,this->mnf,address,false);
  return;
}

Assistant:

void CStructure::emitlab(char* iid, aint address, const bool isRelocatable) {
	const aint misalignment = maxAlignment ? ((-address) & (maxAlignment - 1)) : 0;
	if (misalignment) {
		// emitting in misaligned position (considering the ALIGN used to define this struct)
		char warnTxt[LINEMAX];
		SPRINTF3(warnTxt, LINEMAX,
					"Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
					naam, maxAlignment, misalignment);
		Warning(warnTxt);
	}
	char sn[LINEMAX] { 0 };
	STRCPY(sn, LINEMAX-1, iid);
	InsertSingleStructLabel(true, sn, isRelocatable, address, false);
	STRCAT(sn, LINEMAX-1, ".");
	InsertStructSubLabels(sn, isRelocatable, mnf, address, false);
}